

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnDelegateExpr
          (BinaryReaderInterp *this,Index depth)

{
  pointer *ppLVar1;
  uint uVar2;
  int iVar3;
  State *pSVar4;
  pointer pLVar5;
  pointer pHVar6;
  Result RVar7;
  Enum EVar8;
  Offset OVar9;
  long lVar10;
  ulong uVar11;
  pointer pLVar12;
  ulong uVar13;
  Location loc_1;
  Location loc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  pSVar4 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar4->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar4->offset;
  Var::Var(&local_78,depth,&local_b8);
  RVar7 = SharedValidator::OnDelegate(&this->validator_,&local_98,&local_78);
  Var::~Var(&local_78);
  EVar8 = Error;
  if (RVar7.enum_ != Error) {
    pLVar12 = (this->label_stack_).
              super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar5 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar10 = (long)pLVar5 - (long)pLVar12;
    if (lVar10 == 0) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x186,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    if (pLVar5[-1].kind != Try) {
      __assert_fail("label->kind == LabelKind::Try",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6b4,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    uVar2 = *(uint *)((long)pLVar12 + lVar10 + -4);
    pHVar6 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar6[uVar2].kind = Delegate;
    iVar3 = *(int *)((long)pLVar12 + lVar10 + -0xc);
    Istream::Emit(this->istream_,Br);
    if (iVar3 != -1) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6b9,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    pLVar12 = (this->label_stack_).
              super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pLVar5 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar9 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar12 - (long)pLVar5) >> 4) - 1,
                     OVar9);
    Istream::Emit(this->istream_,0xffffffff);
    OVar9 = Istream::end(this->istream_);
    pHVar6[uVar2].try_end_offset = OVar9;
    uVar13 = (ulong)(depth + 1);
    pLVar12 = (this->label_stack_).
              super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = (long)pLVar12 -
             (long)(this->label_stack_).
                   super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar10 = uVar11 - uVar13;
    if (uVar13 <= uVar11 && lVar10 != 0) {
      pLVar12 = pLVar12 + -uVar13;
      do {
        pLVar12 = pLVar12 + -1;
        if (pLVar12->kind == Try) goto LAB_0011f3b9;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pLVar12 = (pointer)0x0;
LAB_0011f3b9:
    if (pLVar12 == (pointer)0x0) {
      __assert_fail("target_label",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6be,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    pHVar6[uVar2].field_4 = (anon_union_4_2_59e55c6f_for_HandlerDesc_4)pLVar12->handler_desc_index;
    FixupMap::Resolve(&this->depth_fixups_,this->istream_,
                      (int)((ulong)((long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->label_stack_).
                                         super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1);
    ppLVar1 = &(this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + -1;
    EVar8 = Ok;
  }
  return (Result)EVar8;
}

Assistant:

Result BinaryReaderInterp::OnDelegateExpr(Index depth) {
  CHECK_RESULT(validator_.OnDelegate(GetLocation(), Var(depth, GetLocation())));
  Label* label = TopLabel();
  assert(label->kind == LabelKind::Try);
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Delegate;
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  desc.try_end_offset = istream_.end();
  Label* target_label = GetNearestTryLabel(depth + 1);
  assert(target_label);
  desc.delegate_handler_index = target_label->handler_desc_index;
  FixupTopLabel();
  PopLabel();
  return Result::Ok;
}